

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O0

void density_tests::heterogeneous_queue_samples(ostream *i_ostream)

{
  void **ppvVar1;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  value_type *pvVar6;
  MessageInABottle *pMVar7;
  runtime_type<> *prVar8;
  ostream *poVar9;
  add_cv_qual_t<int,_(density::cv_qual)0> *paVar10;
  difference_type dVar11;
  difference_type dVar12;
  allocator_type *paVar13;
  pair<double,_int> pVar14;
  bool local_e4a;
  byte local_e49;
  bool local_e3a;
  bool local_e39;
  bool local_e12;
  byte local_e11;
  bool local_c39;
  undefined1 local_bd0 [7];
  bool bool_2_1;
  reentrant_consume_operation consume_2_3;
  undefined1 local_bb8 [7];
  bool bool_1_1;
  reentrant_consume_operation consume_1_3;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_26;
  reentrant_consume_operation consume_2_2;
  undefined1 local_b80 [8];
  reentrant_consume_operation consume_1_2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_25;
  reentrant_consume_operation consume_7;
  int local_b48;
  undefined1 local_b41;
  undefined1 local_b40 [7];
  bool pop_result_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_24;
  consume_operation consume_6;
  undefined1 local_b18 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_23;
  reentrant_consume_operation consume1;
  reentrant_consume_operation consume2;
  reentrant_put_transaction<void> local_ae0;
  undefined1 local_ac8 [8];
  reentrant_put_transaction<void> put_3;
  double pi;
  undefined1 local_a90 [8];
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  put_2;
  reentrant_put_transaction<int> local_a70;
  undefined1 local_a58 [8];
  reentrant_put_transaction<int> put_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_22;
  undefined1 local_a28 [7];
  bool bool_2;
  consume_operation consume_2_1;
  undefined1 local_a10 [7];
  bool bool_1;
  consume_operation consume_1_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_21;
  consume_operation consume_2;
  undefined1 local_9d8 [8];
  consume_operation consume_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_20;
  consume_operation consume_5;
  int local_9a0;
  undefined1 local_999;
  undefined1 local_998 [7];
  bool pop_result;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_19;
  consume_operation consume_4;
  undefined1 local_970 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_18;
  undefined1 local_958 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_17;
  undefined1 local_940 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_16;
  const_iterator local_910;
  iterator local_8f0;
  iterator local_8d0;
  const_iterator local_8b0;
  const_iterator local_890;
  iterator local_870;
  iterator local_850;
  int local_82c;
  undefined1 local_828 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1_6;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_15;
  const_iterator local_7e8;
  iterator local_7c8;
  iterator local_7a8;
  const_iterator local_788;
  const_iterator local_768;
  iterator local_748;
  iterator local_728;
  int local_704;
  undefined1 local_700 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1_5;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_14;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *queue_ref;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_13;
  undefined1 local_6b8 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_12;
  undefined1 local_6a0 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_11;
  const_iterator local_670;
  iterator local_650;
  iterator local_630;
  const_iterator local_610;
  const_iterator local_5f0;
  iterator local_5d0;
  iterator local_5b0;
  undefined1 local_590 [8];
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  queue_1_4;
  int local_56c;
  double local_568;
  pair<double,_int> local_560;
  string local_550 [32];
  undefined1 local_530 [8];
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  queue_10;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  queue_1_3;
  int local_4fc;
  double local_4f8;
  pair<double,_int> local_4f0;
  string local_4e0 [32];
  undefined1 local_4c0 [8];
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  queue_9;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_8;
  undefined1 local_498 [7];
  default_allocator allocator_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_7;
  undefined1 local_480 [7];
  default_allocator allocator;
  const_iterator local_460;
  iterator local_440;
  iterator local_420;
  const_iterator local_400;
  const_iterator local_3e0;
  iterator local_3c0;
  iterator local_3a0;
  undefined1 local_380 [8];
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  queue_1_2;
  int local_35c;
  double local_358;
  pair<double,_int> local_350;
  string local_340 [32];
  undefined1 local_320 [8];
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  queue_6;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  queue_1_1;
  int local_2ec;
  double local_2e8;
  pair<double,_int> local_2e0;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  queue_5;
  const_iterator local_280;
  iterator local_260;
  iterator local_240;
  undefined1 local_220 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_4;
  value_type *value;
  iterator __end2;
  iterator __begin2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *__range2;
  iterator local_1b8;
  byte local_191;
  iterator local_190;
  iterator local_170;
  iterator local_150;
  int local_12c;
  undefined1 local_128 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  consume_operation consume_3;
  undefined1 local_e0 [8];
  put_transaction<MessageInABottle> transaction;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_3;
  string my_string;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_98;
  int local_84;
  undefined1 local_80 [4];
  int my_int;
  consume_operation consume;
  int local_68 [5];
  int local_54;
  undefined1 local_50 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  PrintScopeDuration dur;
  ostream *i_ostream_local;
  
  PrintScopeDuration::PrintScopeDuration
            ((PrintScopeDuration *)&queue.m_tail,i_ostream,"heterogeneous queue samples");
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_50);
  local_54 = 0x13;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_50,&local_54);
  local_68[0] = 8;
  consume.m_control._7_1_ = 0x2a;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,int,char>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             local_50,local_68,(char *)((long)&consume.m_control + 7));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_80);
  piVar4 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::element<int>((consume_operation *)local_80);
  local_84 = *piVar4;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)local_80);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume(&local_98);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::operator=((consume_operation *)local_80,(consume_operation *)&local_98);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&local_98);
  pbVar5 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
           consume_operation::element<std::__cxx11::string>((consume_operation *)local_80);
  std::__cxx11::string::string((string *)&queue_3.m_tail,(string *)pbVar5);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)local_80);
  std::__cxx11::string::~string((string *)&queue_3.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_80);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_50);
  ppvVar1 = &transaction.m_put_data.m_user_storage;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              ppvVar1);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
            ((put_transaction<MessageInABottle> *)&consume_3.m_control,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             ppvVar1);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>::
  put_transaction<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle,void>
            ((put_transaction<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
              *)local_e0,(put_transaction<MessageInABottle> *)&consume_3.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::~put_transaction
            ((put_transaction<MessageInABottle> *)&consume_3.m_control);
  pvVar6 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<MessageInABottle>::raw_allocate_copy<char[13]>
                     ((put_transaction<MessageInABottle> *)local_e0,(char (*) [13])"Hello world!");
  pMVar7 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<MessageInABottle>::element<MessageInABottle,_nullptr>
                     ((put_transaction<MessageInABottle> *)local_e0);
  pMVar7->m_text = pvVar6;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::commit((put_transaction<MessageInABottle> *)local_e0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&queue_1.m_tail);
  prVar8 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type((consume_operation *)&queue_1.m_tail);
  bVar2 = density::runtime_type<>::is<std::__cxx11::string>(prVar8);
  if (bVar2) {
    pbVar5 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
             ::consume_operation::element<std::__cxx11::string>
                       ((consume_operation *)&queue_1.m_tail);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)pbVar5);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  else {
    prVar8 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type((consume_operation *)&queue_1.m_tail);
    bVar2 = density::runtime_type<>::
            is<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>(prVar8);
    if (bVar2) {
      pMVar7 = density::
               heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
               consume_operation::
               element<density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
                         ((consume_operation *)&queue_1.m_tail);
      poVar9 = std::operator<<((ostream *)&std::cout,pMVar7->m_text);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)&queue_1.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &queue_2.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_128);
  local_12c = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &queue_2.m_tail,&local_12c);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::end
            (&local_150,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &queue_2.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::end
            (&local_170,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_128);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::iterator::operator==(&local_150,&local_170);
  local_191 = 0;
  local_c39 = false;
  if (bVar2) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::end
              (&local_190,
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &queue_2.m_tail);
    local_191 = 1;
    memset(&local_1b8,0,0x20);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    iterator::iterator(&local_1b8);
    local_c39 = density::
                heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                iterator::operator==(&local_190,&local_1b8);
  }
  if (local_c39 == false) {
    __assert_fail("queue_1.end() == queue_2.end() && queue_1.end() == heter_queue<>::iterator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x58b,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  if (bVar2) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    iterator::~iterator(&local_1b8);
  }
  if ((local_191 & 1) != 0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    iterator::~iterator(&local_190);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator(&local_170);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator(&local_150);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            ((iterator *)&__end2.m_value.m_pair.m_type,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &queue_2.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::end
            ((iterator *)&value,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &queue_2.m_tail);
  while (bVar2 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 iterator::operator!=((iterator *)&__end2.m_value.m_pair.m_type,(iterator *)&value),
        bVar2) {
    queue_4.m_tail =
         (ControlBlock *)
         density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         iterator::operator*((iterator *)&__end2.m_value.m_pair.m_type);
    paVar10 = density::dynamic_reference<density::runtime_type<>,_(density::cv_qual)0>::as<int>
                        ((dynamic_reference<density::runtime_type<>,_(density::cv_qual)0> *)
                         queue_4.m_tail);
    if (*paVar10 != 0x2a) {
      __assert_fail("value.as<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x58f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    iterator::operator++((iterator *)&__end2.m_value.m_pair.m_type);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator((iterator *)&value);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator((iterator *)&__end2.m_value.m_pair.m_type);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_128);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &queue_2.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_1.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::~put_transaction((put_transaction<MessageInABottle> *)local_e0)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &transaction.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_220);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_220);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x597,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_240,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_220);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::end
            (&local_260,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_220);
  dVar11 = std::
           distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_240,&local_260);
  if (dVar11 != 0) {
    __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x598,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator(&local_260);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator(&local_240);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            (&local_280,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_220);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cend
            ((const_iterator *)&queue_5.m_tail,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_220);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator==(&local_280,(const_iterator *)&queue_5.m_tail);
  if (!bVar2) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x599,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator((const_iterator *)&queue_5.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator(&local_280);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_220);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_2b0);
  std::__cxx11::string::string(local_2d0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::push<std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)local_2b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
  std::__cxx11::string::~string(local_2d0);
  local_2e8 = 4.0;
  local_2ec = 1;
  pVar14 = std::make_pair<double,int>(&local_2e8,&local_2ec);
  local_2e0.first = pVar14.first;
  local_2e0.second = pVar14.second;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::push<std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)local_2b0,&local_2e0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&queue_6.m_tail,
                (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_2b0);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::operator==((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)local_2b0,
                       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)&queue_6.m_tail);
  if (!bVar2) {
    __assert_fail("queue == queue_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5ab,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                  *)&queue_6.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                  *)local_2b0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_320);
  std::__cxx11::string::string(local_340);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::push<std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)local_320,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
  std::__cxx11::string::~string(local_340);
  local_358 = 4.0;
  local_35c = 1;
  pVar14 = std::make_pair<double,int>(&local_358,&local_35c);
  queue_1_2.m_tail = (ControlBlock *)pVar14.first;
  local_350.second = pVar14.second;
  local_350.first = (double)queue_1_2.m_tail;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::push<std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)local_320,&local_350);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_380,
                (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_320);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *)local_320);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5be,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_3a0,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)local_320);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::end(&local_3c0,
        (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
         *)local_320);
  dVar12 = std::
           distance<density::heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_3a0,&local_3c0);
  if (dVar12 != 0) {
    __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5bf,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::iterator::~iterator(&local_3c0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::iterator::~iterator(&local_3a0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cbegin(&local_3e0,
           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
            *)local_320);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cend(&local_400,
         (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          *)local_320);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator==(&local_3e0,&local_400);
  if (!bVar2) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c0,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::const_iterator::~const_iterator(&local_400);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::const_iterator::~const_iterator(&local_3e0);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *)local_380);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c2,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_420,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)local_380);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::end(&local_440,
        (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
         *)local_380);
  dVar12 = std::
           distance<density::heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_420,&local_440);
  if (dVar12 != 2) {
    __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c3,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::iterator::~iterator(&local_440);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::iterator::~iterator(&local_420);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cbegin(&local_460,
           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
            *)local_380);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cend((const_iterator *)local_480,
         (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          *)local_380);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator!=(&local_460,(const_iterator *)local_480);
  if (!bVar2) {
    __assert_fail("queue_1.cbegin() != queue_1.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c4,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::const_iterator::~const_iterator((const_iterator *)local_480);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::const_iterator::~const_iterator(&local_460);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                  *)local_380);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                  *)local_320);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_498,(basic_default_allocator<65536UL> *)((long)&queue_7.m_tail + 7));
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_498);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5cb,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_498);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &queue_9.m_tail,(basic_default_allocator<65536UL> *)((long)&queue_8.m_tail + 7));
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&queue_9.m_tail);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5d2,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &queue_9.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_4c0);
  std::__cxx11::string::string(local_4e0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::push<std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)local_4c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e0);
  std::__cxx11::string::~string(local_4e0);
  local_4f8 = 4.0;
  local_4fc = 1;
  pVar14 = std::make_pair<double,int>(&local_4f8,&local_4fc);
  local_4f0.first = pVar14.first;
  local_4f0.second = pVar14.second;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::push<std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)local_4c0,&local_4f0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&queue_10.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::operator=((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)&queue_10.m_tail,
              (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)local_4c0);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::operator==((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)local_4c0,
                       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)&queue_10.m_tail);
  if (!bVar2) {
    __assert_fail("queue == queue_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5e5,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                  *)&queue_10.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                  *)local_4c0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_530);
  std::__cxx11::string::string(local_550);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::push<std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)local_530,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_550);
  std::__cxx11::string::~string(local_550);
  local_568 = 4.0;
  local_56c = 1;
  pVar14 = std::make_pair<double,int>(&local_568,&local_56c);
  queue_1_4.m_tail = (ControlBlock *)pVar14.first;
  local_560.second = pVar14.second;
  local_560.first = (double)queue_1_4.m_tail;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::push<std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)local_530,&local_560);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)local_590);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::operator=((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)local_590,
              (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)local_530);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *)local_530);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5f9,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_5b0,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)local_530);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::end(&local_5d0,
        (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
         *)local_530);
  dVar12 = std::
           distance<density::heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_5b0,&local_5d0);
  if (dVar12 != 0) {
    __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5fa,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::iterator::~iterator(&local_5d0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::iterator::~iterator(&local_5b0);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cbegin(&local_5f0,
           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
            *)local_530);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cend(&local_610,
         (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          *)local_530);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator==(&local_5f0,&local_610);
  if (!bVar2) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5fb,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::const_iterator::~const_iterator(&local_610);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::const_iterator::~const_iterator(&local_5f0);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *)local_590);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5fd,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_630,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)local_590);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::end(&local_650,
        (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
         *)local_590);
  dVar12 = std::
           distance<density::heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_630,&local_650);
  if (dVar12 != 2) {
    __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5fe,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::iterator::~iterator(&local_650);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::iterator::~iterator(&local_630);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cbegin(&local_670,
           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
            *)local_590);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cend((const_iterator *)&queue_11.m_tail,
         (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          *)local_590);
  bVar2 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator!=(&local_670,(const_iterator *)&queue_11.m_tail);
  if (!bVar2) {
    __assert_fail("queue_1.cbegin() != queue_1.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5ff,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::const_iterator::~const_iterator((const_iterator *)&queue_11.m_tail);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::const_iterator::~const_iterator(&local_670);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                  *)local_590);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::~heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                  *)local_530);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_6a0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  get_allocator((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_6a0);
  bVar2 = density::basic_default_allocator<65536UL>::operator==
                    ((basic_default_allocator<65536UL> *)((long)&queue_12.m_tail + 7),
                     (basic_default_allocator<65536UL> *)((long)&queue_12.m_tail + 5));
  if (!bVar2) {
    __assert_fail("queue.get_allocator() == default_allocator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x605,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_6a0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_6b8);
  paVar13 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            get_allocator_ref((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)local_6b8);
  bVar2 = density::basic_default_allocator<65536UL>::operator==
                    (paVar13,(basic_default_allocator<65536UL> *)((long)&queue_13.m_tail + 7));
  if (!bVar2) {
    __assert_fail("queue.get_allocator_ref() == default_allocator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x60b,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_6b8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &queue_ref);
  paVar13 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            get_allocator_ref((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)&queue_ref);
  bVar2 = density::basic_default_allocator<65536UL>::operator==
                    (paVar13,(basic_default_allocator<65536UL> *)((long)&queue_14.m_tail + 7));
  if (!bVar2) {
    __assert_fail("queue_ref.get_allocator_ref() == default_allocator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x612,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &queue_ref);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &queue_1_5.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_700);
  local_704 = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &queue_1_5.m_tail,&local_704);
  density::swap((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                &queue_1_5.m_tail,
                (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_700);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&queue_1_5.m_tail);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x61c,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_728,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &queue_1_5.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::end
            (&local_748,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &queue_1_5.m_tail);
  dVar11 = std::
           distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_728,&local_748);
  if (dVar11 != 0) {
    __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x61d,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator(&local_748);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator(&local_728);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            (&local_768,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &queue_1_5.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cend
            (&local_788,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &queue_1_5.m_tail);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator==(&local_768,&local_788);
  if (!bVar2) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x61e,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator(&local_788);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator(&local_768);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_700);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x620,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_7a8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_700);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::end
            (&local_7c8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_700);
  dVar11 = std::
           distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_7a8,&local_7c8);
  if (dVar11 != 1) {
    __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x621,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator(&local_7c8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  iterator::~iterator(&local_7a8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            (&local_7e8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_700);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cend
            ((const_iterator *)&queue_15.m_tail,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_700);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::const_iterator::operator!=(&local_7e8,(const_iterator *)&queue_15.m_tail);
  if (!bVar2) {
    __assert_fail("queue_1.cbegin() != queue_1.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x622,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator((const_iterator *)&queue_15.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator(&local_7e8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_700);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &queue_1_5.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &queue_1_6.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_828);
  local_82c = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &queue_1_6.m_tail,&local_82c);
  density::swap((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                &queue_1_6.m_tail,
                (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_828);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&queue_1_6.m_tail);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x62d,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_850,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &queue_1_6.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::end
            (&local_870,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &queue_1_6.m_tail);
  dVar11 = std::
           distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_850,&local_870);
  if (dVar11 == 0) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    iterator::~iterator(&local_870);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    iterator::~iterator(&local_850);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cbegin(&local_890,
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &queue_1_6.m_tail);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cend
              (&local_8b0,
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &queue_1_6.m_tail);
    bVar2 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            const_iterator::operator==(&local_890,&local_8b0);
    if (!bVar2) {
      __assert_fail("queue.cbegin() == queue.cend()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x62f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    const_iterator::~const_iterator(&local_8b0);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    const_iterator::~const_iterator(&local_890);
    bVar2 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::empty
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_828);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!queue_1.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x631,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
              (&local_8d0,
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_828);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::end
              (&local_8f0,
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_828);
    dVar11 = std::
             distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                       (&local_8d0,&local_8f0);
    if (dVar11 != 1) {
      __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x632,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    iterator::~iterator(&local_8f0);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    iterator::~iterator(&local_8d0);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cbegin(&local_910,
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           local_828);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cend
              ((const_iterator *)&queue_16.m_tail,
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_828);
    bVar2 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            const_iterator::operator!=(&local_910,(const_iterator *)&queue_16.m_tail);
    if (!bVar2) {
      __assert_fail("queue_1.cbegin() != queue_1.cend()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x633,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    const_iterator::~const_iterator((const_iterator *)&queue_16.m_tail);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    const_iterator::~const_iterator(&local_910);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_828);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )&queue_1_6.m_tail);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_940);
    bVar2 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::empty
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_940);
    if (!bVar2) {
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x639,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    queue_17.m_tail._4_4_ = 1;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_940,(int *)((long)&queue_17.m_tail + 4));
    bVar2 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::empty
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_940);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x63b,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_940);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_958);
    queue_18.m_tail._4_4_ = 1;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_958,(int *)((long)&queue_18.m_tail + 4));
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::clear
              ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_958);
    bVar2 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::empty
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)local_958);
    if (!bVar2) {
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x643,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_958);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_970);
    consume_4.m_control._4_4_ = 1;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_970,(int *)((long)&consume_4.m_control + 4));
    consume_4.m_control._0_4_ = 2;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_970,(int *)&consume_4.m_control);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::pop
              ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_970);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&queue_19.m_tail);
    piVar4 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::element<int>((consume_operation *)&queue_19.m_tail);
    if (*piVar4 != 2) {
      __assert_fail("consume.element<int>() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x64e,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit((consume_operation *)&queue_19.m_tail);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)&queue_19.m_tail);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_970);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_998);
    local_999 = density::
                heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                try_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_998);
    if ((bool)local_999) {
      __assert_fail("pop_result == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x657,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    local_9a0 = 1;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_998,&local_9a0);
    consume_5.m_control._4_4_ = 2;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_998,(int *)((long)&consume_5.m_control + 4));
    local_999 = density::
                heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                try_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_998);
    if (!(bool)local_999) {
      __assert_fail("pop_result == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x65d,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&queue_20.m_tail);
    piVar4 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::element<int>((consume_operation *)&queue_20.m_tail);
    if (*piVar4 != 2) {
      __assert_fail("consume.element<int>() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x65f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit((consume_operation *)&queue_20.m_tail);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)&queue_20.m_tail);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_998);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                &consume_1.m_control);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_9d8);
    bVar2 = density::heter_queue::consume_operation::operator_cast_to_bool
                      ((consume_operation *)local_9d8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!consume_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x669,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    consume_2.m_control._4_4_ = 0x2a;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &consume_1.m_control,(int *)((long)&consume_2.m_control + 4));
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&queue_21.m_tail);
    bVar2 = density::heter_queue::consume_operation::operator_cast_to_bool
                      ((consume_operation *)&queue_21.m_tail);
    if (!bVar2) {
      __assert_fail("consume_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x66e,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    piVar4 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::element<int>((consume_operation *)&queue_21.m_tail);
    if (*piVar4 != 0x2a) {
      __assert_fail("consume_2.element<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x66f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit((consume_operation *)&queue_21.m_tail);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)&queue_21.m_tail);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)local_9d8);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )&consume_1.m_control);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                &consume_1_1.m_control);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::consume_operation((consume_operation *)local_a10);
    consume_2_1.m_control._7_1_ =
         density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            *)&consume_1_1.m_control,(consume_operation *)local_a10);
    local_e11 = 0;
    if (!(bool)consume_2_1.m_control._7_1_) {
      bVar2 = density::heter_queue::consume_operation::operator_cast_to_bool
                        ((consume_operation *)local_a10);
      local_e11 = bVar2 ^ 0xff;
    }
    if ((local_e11 & 1) == 0) {
      __assert_fail("!bool_1 && !consume_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x679,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    consume_2_1.m_control._0_4_ = 0x2a;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &consume_1_1.m_control,(int *)&consume_2_1.m_control);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::consume_operation((consume_operation *)local_a28);
    bVar2 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)&consume_1_1.m_control,(consume_operation *)local_a28);
    bVar3 = density::heter_queue::consume_operation::operator_cast_to_bool
                      ((consume_operation *)local_a28);
    local_e12 = false;
    if (!bVar3) {
      bVar2 = local_e12;
    }
    local_e12 = bVar2;
    if (local_e12 != false) {
      piVar4 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>((consume_operation *)local_a28);
      if (*piVar4 != 0x2a) {
        __assert_fail("consume_2.element<int>() == 42",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x680,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit((consume_operation *)local_a28);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation((consume_operation *)local_a28);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation((consume_operation *)local_a10);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&consume_1_1.m_control);
      ppvVar1 = &put_1.m_put_data.m_user_storage;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)ppvVar1);
      put_2.m_put_data.m_user_storage._4_4_ = 1;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      start_reentrant_push<int>
                (&local_a70,
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )ppvVar1,(int *)((long)&put_2.m_put_data.m_user_storage + 4));
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
                ((reentrant_put_transaction<int> *)local_a58,&local_a70);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<int>::~reentrant_put_transaction(&local_a70);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      start_reentrant_emplace<std::__cxx11::string,char_const(&)[13]>
                ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pi,(heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                         *)&put_1.m_put_data.m_user_storage,(char (*) [13])"Hello world!");
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      reentrant_put_transaction<std::__cxx11::string>::
      reentrant_put_transaction<std::__cxx11::string,void>
                ((reentrant_put_transaction<std::__cxx11::string> *)local_a90,
                 (reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pi);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~reentrant_put_transaction
                ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pi);
      put_3.m_put_data.m_user_storage = (void *)0x40091eb851eb851f;
      consume2.m_control = (ControlBlock *)density::runtime_type<>::make<double>();
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      start_reentrant_dyn_push_copy
                (&local_ae0,
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )&put_1.m_put_data.m_user_storage,(runtime_type<> *)&consume2.m_control,
                 &put_3.m_put_data.m_user_storage);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
                ((reentrant_put_transaction<void> *)local_ac8,&local_ae0);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<void>::~reentrant_put_transaction(&local_ae0);
      bVar2 = density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&put_1.m_put_data.m_user_storage);
      if (!bVar2) {
        __assert_fail("queue.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x690,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::commit((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a90);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      try_start_reentrant_consume
                ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )&consume1.m_control);
      bVar2 = density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_consume_operation::empty((reentrant_consume_operation *)&consume1.m_control)
      ;
      local_e39 = false;
      if (!bVar2) {
        prVar8 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 reentrant_consume_operation::complete_type
                           ((reentrant_consume_operation *)&consume1.m_control);
        local_e39 = density::runtime_type<>::is<std::__cxx11::string>(prVar8);
      }
      if (local_e39 == false) {
        __assert_fail("!consume2.empty() && consume2.complete_type().is<std::string>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x695,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<int>::commit((reentrant_put_transaction<int> *)local_a58);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      try_start_reentrant_consume
                ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )&queue_23.m_tail);
      bVar2 = density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_consume_operation::empty((reentrant_consume_operation *)&queue_23.m_tail);
      local_e3a = false;
      if (!bVar2) {
        prVar8 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 reentrant_consume_operation::complete_type
                           ((reentrant_consume_operation *)&queue_23.m_tail);
        local_e3a = density::runtime_type<>::is<int>(prVar8);
      }
      if (local_e3a == false) {
        __assert_fail("!consume1.empty() && consume1.complete_type().is<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x69a,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<void>::cancel((reentrant_put_transaction<void> *)local_ac8);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_consume_operation::commit((reentrant_consume_operation *)&queue_23.m_tail);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_consume_operation::commit((reentrant_consume_operation *)&consume1.m_control);
      bVar2 = density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&put_1.m_put_data.m_user_storage);
      if (!bVar2) {
        __assert_fail("queue.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x6a0,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_consume_operation::~reentrant_consume_operation
                ((reentrant_consume_operation *)&queue_23.m_tail);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_consume_operation::~reentrant_consume_operation
                ((reentrant_consume_operation *)&consume1.m_control);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<void>::~reentrant_put_transaction
                ((reentrant_put_transaction<void> *)local_ac8);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~reentrant_put_transaction
                ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_a90);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<int>::~reentrant_put_transaction
                ((reentrant_put_transaction<int> *)local_a58);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&put_1.m_put_data.m_user_storage);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_b18);
      consume_6.m_control._4_4_ = 1;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_b18,(int *)((long)&consume_6.m_control + 4));
      consume_6.m_control._0_4_ = 2;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_b18,(int *)&consume_6.m_control);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_b18);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)&queue_24.m_tail);
      piVar4 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>((consume_operation *)&queue_24.m_tail);
      if (*piVar4 != 2) {
        __assert_fail("consume.element<int>() == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x6ac,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit((consume_operation *)&queue_24.m_tail);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation((consume_operation *)&queue_24.m_tail);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_b18);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)local_b40);
      local_b41 = density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  try_reentrant_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                     *)local_b40);
      if ((bool)local_b41) {
        __assert_fail("pop_result == false",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x6b5,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      local_b48 = 1;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_b40,&local_b48);
      consume_7.m_control._4_4_ = 2;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                local_b40,(int *)((long)&consume_7.m_control + 4));
      local_b41 = density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  try_reentrant_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                     *)local_b40);
      if ((bool)local_b41) {
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        try_start_reentrant_consume
                  ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&queue_25.m_tail);
        piVar4 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 reentrant_consume_operation::element<int>
                           ((reentrant_consume_operation *)&queue_25.m_tail);
        if (*piVar4 != 2) {
          __assert_fail("consume.element<int>() == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x6bd,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
        }
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        reentrant_consume_operation::commit((reentrant_consume_operation *)&queue_25.m_tail);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        reentrant_consume_operation::~reentrant_consume_operation
                  ((reentrant_consume_operation *)&queue_25.m_tail);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      *)local_b40);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&consume_1_2.m_control);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        try_start_reentrant_consume
                  ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)local_b80);
        bVar2 = density::heter_queue::reentrant_consume_operation::operator_cast_to_bool
                          ((reentrant_consume_operation *)local_b80);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!consume_1",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x6c7,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
        }
        consume_2_2.m_control._4_4_ = 0x2a;
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&consume_1_2.m_control,(int *)((long)&consume_2_2.m_control + 4));
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        try_start_reentrant_consume
                  ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)&queue_26.m_tail);
        bVar2 = density::heter_queue::reentrant_consume_operation::operator_cast_to_bool
                          ((reentrant_consume_operation *)&queue_26.m_tail);
        if (!bVar2) {
          __assert_fail("consume_2",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x6cc,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
        }
        piVar4 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 reentrant_consume_operation::element<int>
                           ((reentrant_consume_operation *)&queue_26.m_tail);
        if (*piVar4 == 0x2a) {
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_consume_operation::commit((reentrant_consume_operation *)&queue_26.m_tail);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_consume_operation::~reentrant_consume_operation
                    ((reentrant_consume_operation *)&queue_26.m_tail);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_consume_operation::~reentrant_consume_operation
                    ((reentrant_consume_operation *)local_b80);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          *)&consume_1_2.m_control);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)&consume_1_3.m_control);
          density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_consume_operation::reentrant_consume_operation
                    ((reentrant_consume_operation *)local_bb8);
          consume_2_3.m_control._7_1_ =
               density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               try_start_reentrant_consume
                         ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)&consume_1_3.m_control,(reentrant_consume_operation *)local_bb8);
          local_e49 = 0;
          if (!(bool)consume_2_3.m_control._7_1_) {
            bVar2 = density::heter_queue::reentrant_consume_operation::operator_cast_to_bool
                              ((reentrant_consume_operation *)local_bb8);
            local_e49 = bVar2 ^ 0xff;
          }
          if ((local_e49 & 1) != 0) {
            consume_2_3.m_control._0_4_ = 0x2a;
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&consume_1_3.m_control,(int *)&consume_2_3.m_control);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_consume_operation::reentrant_consume_operation
                      ((reentrant_consume_operation *)local_bd0);
            bVar2 = density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::try_start_reentrant_consume
                              ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                *)&consume_1_3.m_control,(reentrant_consume_operation *)local_bd0);
            bVar3 = density::heter_queue::reentrant_consume_operation::operator_cast_to_bool
                              ((reentrant_consume_operation *)local_bd0);
            local_e4a = false;
            if (!bVar3) {
              bVar2 = local_e4a;
            }
            local_e4a = bVar2;
            if (local_e4a != false) {
              piVar4 = density::
                       heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       ::reentrant_consume_operation::element<int>
                                 ((reentrant_consume_operation *)local_bd0);
              if (*piVar4 != 0x2a) {
                __assert_fail("consume_2.element<int>() == 42",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                              ,0x6de,
                              "void density_tests::heterogeneous_queue_samples(std::ostream &)");
              }
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_consume_operation::commit((reentrant_consume_operation *)local_bd0);
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_consume_operation::~reentrant_consume_operation
                        ((reentrant_consume_operation *)local_bd0);
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_consume_operation::~reentrant_consume_operation
                        ((reentrant_consume_operation *)local_bb8);
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                            *)&consume_1_3.m_control);
              heterogeneous_queue_put_samples();
              heterogeneous_queue_put_transaction_samples();
              heterogeneous_queue_consume_operation_samples();
              heterogeneous_queue_reentrant_put_samples();
              heterogeneous_queue_reentrant_put_transaction_samples();
              heterogeneous_queue_reentrant_consume_operation_samples();
              PrintScopeDuration::~PrintScopeDuration((PrintScopeDuration *)&queue.m_tail);
              return;
            }
            __assert_fail("consume_2 && bool_2",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x6dd,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
          }
          __assert_fail("!bool_1 && !consume_1",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                        ,0x6d7,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
        }
        __assert_fail("consume_2.element<int>() == 42",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x6cd,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
      __assert_fail("pop_result == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x6bb,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    __assert_fail("consume_2 && bool_2",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x67f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                ,0x62e,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
}

Assistant:

void heterogeneous_queue_samples(std::ostream & i_ostream)
    {
        PrintScopeDuration dur(i_ostream, "heterogeneous queue samples");

        using namespace density;

        {
            //! [heter_queue put example 1]
            heter_queue<> queue;
            queue.push(19);                     // the parameter can be an l-value or an r-value
            queue.emplace<std::string>(8, '*'); // pushes "********"
            //! [heter_queue put example 1]

            //! [heter_queue example 2]
            auto consume = queue.try_start_consume();
            int  my_int  = consume.element<int>();
            consume.commit();

            consume               = queue.try_start_consume();
            std::string my_string = consume.element<std::string>();
            consume.commit();
            //! [heter_queue example 3
            (void)my_int;
            (void)my_string;
        }

        {
            //! [heter_queue put example 2]
            heter_queue<> queue;
            struct MessageInABottle
            {
                const char * m_text = nullptr;
            };
            auto transaction             = queue.start_emplace<MessageInABottle>();
            transaction.element().m_text = transaction.raw_allocate_copy("Hello world!");
            transaction.commit();
            //! [heter_queue put example 2]

            //! [heter_queue consume example 1]
            auto consume = queue.try_start_consume();
            if (consume.complete_type().is<std::string>())
            {
                std::cout << consume.element<std::string>() << std::endl;
            }
            else if (consume.complete_type().is<MessageInABottle>())
            {
                std::cout << consume.element<MessageInABottle>().m_text << std::endl;
            }
            consume.commit();
            //! [heter_queue consume example 1]

            //! [heter_queue iterators example 1]
            heter_queue<> queue_1, queue_2;
            queue_1.push(42);
            assert(queue_1.end() == queue_2.end() && queue_1.end() == heter_queue<>::iterator());

            for (const auto & value : queue_1)
            {
                assert(value.as<int>() == 42);
            }
            //! [heter_queue iterators example 1]
        }

        {
            //! [heter_queue default_construct example 1]
            heter_queue<> queue;
            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());
            //! [heter_queue default_construct example 1]
        }
        {
            //! [heter_queue copy_construct example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1(queue);
            assert(queue == queue_1);
            //! [heter_queue copy_construct example 1]
        }
        {
            //! [heter_queue move_construct example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1(std::move(queue));

            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 2);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue move_construct example 1]
        }
        {
            //! [heter_queue construct_copy_alloc example 1]
            default_allocator allocator;
            heter_queue<>     queue(allocator);
            assert(queue.empty());
            //! [heter_queue construct_copy_alloc example 1]
        }
        {
            //! [heter_queue construct_move_alloc example 1]
            default_allocator allocator;
            heter_queue<>     queue(std::move(allocator));
            assert(queue.empty());
            //! [heter_queue construct_move_alloc example 1]
        }
        {
            //! [heter_queue copy_assign example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1;
            queue_1 = queue;
            assert(queue == queue_1);
            //! [heter_queue copy_assign example 1]
        }
        {
            //! [heter_queue move_assign example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1;
            queue_1 = std::move(queue);

            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 2);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue move_assign example 1]
        }
        {
            //! [heter_queue get_allocator example 1]
            heter_queue<> queue;
            assert(queue.get_allocator() == default_allocator());
            //! [heter_queue get_allocator example 1]
        }
        {
            //! [heter_queue get_allocator_ref example 1]
            heter_queue<> queue;
            assert(queue.get_allocator_ref() == default_allocator());
            //! [heter_queue get_allocator_ref example 1]
        }
        {
            //! [heter_queue get_allocator_ref example 2]
            heter_queue<> queue;
            auto const &  queue_ref = queue;
            assert(queue_ref.get_allocator_ref() == default_allocator());
            //! [heter_queue get_allocator_ref example 2]
            (void)queue_ref;
        }
        {
            //! [heter_queue swap example 1]
            heter_queue<> queue, queue_1;
            queue.push(1);
            swap(queue, queue_1);

            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 1);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue swap example 1]
        }
        {
            //! [heter_queue swap example 2]
            heter_queue<> queue, queue_1;
            queue.push(1);
            {
                using namespace std;
                swap(queue, queue_1);
            }
            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 1);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue swap example 2]
        }
        {
            //! [heter_queue empty example 1]
            heter_queue<> queue;
            assert(queue.empty());
            queue.push(1);
            assert(!queue.empty());
            //! [heter_queue empty example 1]
        }
        {
            //! [heter_queue clear example 1]
            heter_queue<> queue;
            queue.push(1);
            queue.clear();
            assert(queue.empty());
            //! [heter_queue clear example 1]
        }
        {
            //! [heter_queue pop example 1]
            heter_queue<> queue;
            queue.push(1);
            queue.push(2);

            queue.pop();
            auto consume = queue.try_start_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue pop example 1]
        }
        {
            //! [heter_queue try_pop example 1]
            heter_queue<> queue;

            bool pop_result = queue.try_pop();
            assert(pop_result == false);

            queue.push(1);
            queue.push(2);

            pop_result = queue.try_pop();
            assert(pop_result == true);
            auto consume = queue.try_start_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue try_pop example 1]
            (void)pop_result;
        }
        {
            //! [heter_queue try_start_consume example 1]
            heter_queue<> queue;

            auto consume_1 = queue.try_start_consume();
            assert(!consume_1);

            queue.push(42);

            auto consume_2 = queue.try_start_consume();
            assert(consume_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_consume example 1]
        }
        {
            //! [heter_queue try_start_consume_ example 1]
            heter_queue<> queue;

            heter_queue<>::consume_operation consume_1;
            bool const                       bool_1 = queue.try_start_consume(consume_1);
            assert(!bool_1 && !consume_1);

            queue.push(42);

            heter_queue<>::consume_operation consume_2;
            auto                             bool_2 = queue.try_start_consume(consume_2);
            assert(consume_2 && bool_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_consume_ example 1]
            (void)bool_1;
            (void)bool_2;
        }
        {
            heter_queue<> queue;

            //! [heter_queue reentrant example 1]
            // start 3 reentrant put transactions
            auto   put_1 = queue.start_reentrant_push(1);
            auto   put_2 = queue.start_reentrant_emplace<std::string>("Hello world!");
            double pi    = 3.14;
            auto   put_3 = queue.start_reentrant_dyn_push_copy(runtime_type<>::make<double>(), &pi);
            assert(
              queue.empty()); // the queue is still empty, because no transaction has been committed

            // commit and start consuming "Hello world!"
            put_2.commit();
            auto consume2 = queue.try_start_reentrant_consume();
            assert(!consume2.empty() && consume2.complete_type().is<std::string>());

            // commit and start consuming 1
            put_1.commit();
            auto consume1 = queue.try_start_reentrant_consume();
            assert(!consume1.empty() && consume1.complete_type().is<int>());

            // cancel 3.14, and commit the consumes
            put_3.cancel();
            consume1.commit();
            consume2.commit();
            assert(queue.empty());

            //! [heter_queue reentrant example 1]
        }
        {
            //! [heter_queue reentrant_pop example 1]
            heter_queue<> queue;
            queue.push(1);
            queue.push(2);

            queue.reentrant_pop();
            auto consume = queue.try_start_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue reentrant_pop example 1]
        }
        {
            //! [heter_queue try_reentrant_pop example 1]
            heter_queue<> queue;

            bool pop_result = queue.try_reentrant_pop();
            assert(pop_result == false);

            queue.push(1);
            queue.push(2);

            pop_result = queue.try_reentrant_pop();
            assert(pop_result == true);
            auto consume = queue.try_start_reentrant_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue try_reentrant_pop example 1]
            (void)pop_result;
        }
        {
            //! [heter_queue try_start_reentrant_consume example 1]
            heter_queue<> queue;

            auto consume_1 = queue.try_start_reentrant_consume();
            assert(!consume_1);

            queue.push(42);

            auto consume_2 = queue.try_start_reentrant_consume();
            assert(consume_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_reentrant_consume example 1]
        }
        {
            //! [heter_queue try_start_reentrant_consume_ example 1]
            heter_queue<> queue;

            heter_queue<>::reentrant_consume_operation consume_1;
            bool const bool_1 = queue.try_start_reentrant_consume(consume_1);
            assert(!bool_1 && !consume_1);

            queue.push(42);

            heter_queue<>::reentrant_consume_operation consume_2;
            auto bool_2 = queue.try_start_reentrant_consume(consume_2);
            assert(consume_2 && bool_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_reentrant_consume_ example 1]
            (void)bool_1;
            (void)bool_2;
        }

        // this samples uses std::cout and std::cin
        // heterogeneous_queue_samples_1();

        heterogeneous_queue_put_samples();

        heterogeneous_queue_put_transaction_samples();

        heterogeneous_queue_consume_operation_samples();

        heterogeneous_queue_reentrant_put_samples();

        heterogeneous_queue_reentrant_put_transaction_samples();

        heterogeneous_queue_reentrant_consume_operation_samples();
    }